

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O0

duckdb_aggregate_function duckdb_create_aggregate_function(void)

{
  duckdb_aggregate_function p_Var1;
  aggregate_statistics_t unaff_retaddr;
  aggregate_window_t in_stack_00000008;
  aggregate_serialize_t in_stack_00000010;
  aggregate_deserialize_t in_stack_00000018;
  AggregateFunction *function;
  code *other;
  shared_ptr<duckdb::AggregateFunctionInfo,_true> *this;
  undefined8 in_stack_ffffffffffffff28;
  LogicalTypeId id;
  LogicalType *in_stack_ffffffffffffff30;
  aggregate_initialize_t in_stack_ffffffffffffff98;
  aggregate_size_t in_stack_ffffffffffffffa0;
  LogicalType *return_type;
  vector<duckdb::LogicalType,_true> *arguments;
  string *name;
  AggregateFunction *in_stack_ffffffffffffffc0;
  aggregate_update_t in_stack_ffffffffffffffd0;
  aggregate_combine_t in_stack_ffffffffffffffd8;
  aggregate_finalize_t in_stack_ffffffffffffffe0;
  aggregate_simple_update_t in_stack_ffffffffffffffe8;
  bind_aggregate_function_t in_stack_fffffffffffffff0;
  aggregate_destructor_t in_stack_fffffffffffffff8;
  
  id = (LogicalTypeId)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  p_Var1 = (duckdb_aggregate_function)operator_new(0x130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,anon_var_dwarf_3eb64fd + 9,
             (allocator *)&stack0xffffffffffffffd7);
  return_type = (LogicalType *)0x0;
  arguments = (vector<duckdb::LogicalType,_true> *)0x0;
  name = (string *)0x0;
  duckdb::vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x19068bf);
  duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff30,id);
  other = duckdb::CAPIAggregateFinalize;
  this = (shared_ptr<duckdb::AggregateFunctionInfo,_true> *)0x0;
  duckdb::AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffc0,name,arguments,return_type,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,
             in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018);
  duckdb::LogicalType::~LogicalType((LogicalType *)0x190697a);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1906987)
  ;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  duckdb::make_shared_ptr<duckdb::CAggregateFunctionInfo>();
  duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::
  operator=<duckdb::CAggregateFunctionInfo,_0>
            (this,(shared_ptr<duckdb::CAggregateFunctionInfo,_true> *)other);
  duckdb::shared_ptr<duckdb::CAggregateFunctionInfo,_true>::~shared_ptr
            ((shared_ptr<duckdb::CAggregateFunctionInfo,_true> *)0x19069e2);
  return p_Var1;
}

Assistant:

duckdb_aggregate_function duckdb_create_aggregate_function() {
	auto function = new duckdb::AggregateFunction("", {}, duckdb::LogicalType::INVALID, duckdb::CAPIAggregateStateSize,
	                                              duckdb::CAPIAggregateStateInit, duckdb::CAPIAggregateUpdate,
	                                              duckdb::CAPIAggregateCombine, duckdb::CAPIAggregateFinalize, nullptr,
	                                              duckdb::CAPIAggregateBind);
	function->function_info = duckdb::make_shared_ptr<duckdb::CAggregateFunctionInfo>();
	return reinterpret_cast<duckdb_aggregate_function>(function);
}